

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.tab.hh
# Opt level: O1

shared_ptr<tchecker::parsing::sync_constraint_t> * __thiscall
tchecker::parsing::system::parser_t::value_type::
as<std::shared_ptr<tchecker::parsing::sync_constraint_t>>(value_type *this)

{
  char *__s1;
  int iVar1;
  
  if (this->yytypeid_ == (type_info *)0x0) {
    __assert_fail("yytypeid_",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O1/src/parsing/system_parser/system.tab.hh"
                  ,0x144,
                  "T &tchecker::parsing::system::parser_t::value_type::as() [T = std::shared_ptr<tchecker::parsing::sync_constraint_t>]"
                 );
  }
  __s1 = *(char **)(this->yytypeid_ + 8);
  if (__s1 == "St10shared_ptrIN8tchecker7parsing17sync_constraint_tEE") {
    return (shared_ptr<tchecker::parsing::sync_constraint_t> *)this;
  }
  if ((*__s1 != '*') &&
     (iVar1 = strcmp(__s1,"St10shared_ptrIN8tchecker7parsing17sync_constraint_tEE"), iVar1 == 0)) {
    return (shared_ptr<tchecker::parsing::sync_constraint_t> *)this;
  }
  __assert_fail("*yytypeid_ == typeid (T)",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/build_O1/src/parsing/system_parser/system.tab.hh"
                ,0x145,
                "T &tchecker::parsing::system::parser_t::value_type::as() [T = std::shared_ptr<tchecker::parsing::sync_constraint_t>]"
               );
}

Assistant:

T&
    as () YY_NOEXCEPT
    {
      SPYY_ASSERT (yytypeid_);
      SPYY_ASSERT (*yytypeid_ == typeid (T));
      SPYY_ASSERT (sizeof (T) <= size);
      return *yyas_<T> ();
    }